

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_buffer.cpp
# Opt level: O1

void __thiscall
duckdb::FixedSizeBuffer::SetAllocationSize
          (FixedSizeBuffer *this,idx_t available_segments,idx_t segment_size,idx_t bitmask_offset)

{
  ulong uVar1;
  data_ptr_t pdVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (this->dirty == true) {
    pdVar2 = Get(this,true);
    uVar3 = available_segments;
    uVar4 = available_segments;
    if (available_segments != 0) {
      do {
        uVar1 = uVar3 - 1;
        if ((pdVar2 != (data_ptr_t)0x0) &&
           (uVar4 = uVar3, (*(ulong *)(pdVar2 + (uVar1 >> 6) * 8) >> (uVar1 & 0x3f) & 1) == 0))
        break;
        uVar3 = uVar1;
        uVar4 = available_segments;
      } while (uVar1 != 0);
    }
    this->allocation_size = uVar4 * segment_size + bitmask_offset;
  }
  return;
}

Assistant:

void FixedSizeBuffer::SetAllocationSize(const idx_t available_segments, const idx_t segment_size,
                                        const idx_t bitmask_offset) {
	if (!dirty) {
		return;
	}

	// We traverse from the back. A binary search would be faster.
	// However, buffers are often (almost) full, so the overhead is acceptable.
	auto bitmask_ptr = reinterpret_cast<validity_t *>(Get());
	ValidityMask mask(bitmask_ptr, available_segments);

	auto max_offset = available_segments;
	for (idx_t i = available_segments; i > 0; i--) {
		if (!mask.RowIsValid(i - 1)) {
			max_offset = i;
			break;
		}
	}
	allocation_size = max_offset * segment_size + bitmask_offset;
}